

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O0

TValue * cpwriter(lua_State *L,lua_CFunction dummy,void *ud)

{
  char *pcVar1;
  BCWriteCtx *in_RDX;
  lua_State *in_RSI;
  BCWriteCtx *ctx;
  
  pcVar1 = (char *)lj_mem_realloc(in_RSI,in_RDX,(MSize)((ulong)in_RDX >> 0x20),(MSize)in_RDX);
  (in_RDX->sb).buf = pcVar1;
  (in_RDX->sb).sz = 0x400;
  bcwrite_header((BCWriteCtx *)in_RSI);
  bcwrite_proto((BCWriteCtx *)ud,(GCproto *)ctx);
  bcwrite_footer(in_RDX);
  return (TValue *)0x0;
}

Assistant:

static TValue *cpwriter(lua_State *L, lua_CFunction dummy, void *ud)
{
  BCWriteCtx *ctx = (BCWriteCtx *)ud;
  UNUSED(dummy);
  lj_str_resizebuf(L, &ctx->sb, 1024);  /* Avoids resize for most prototypes. */
  bcwrite_header(ctx);
  bcwrite_proto(ctx, ctx->pt);
  bcwrite_footer(ctx);
  return NULL;
}